

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_CopyConstructWithArena_Test::
RepeatedPtrFieldTest_CopyConstructWithArena_Test
          (RepeatedPtrFieldTest_CopyConstructWithArena_Test *this)

{
  RepeatedPtrFieldTest_CopyConstructWithArena_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldTest_CopyConstructWithArena_Test_029ea6e0;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, CopyConstructWithArena) {
  auto token = internal::InternalVisibilityForTesting{};
  RepeatedPtrField<std::string> source;
  source.Add()->assign("1");
  source.Add()->assign("2");

  Arena arena;
  RepeatedPtrField<std::string> destination(token, &arena, source);
  ASSERT_EQ(2, destination.size());
  EXPECT_EQ("1", destination.Get(0));
  EXPECT_EQ("2", destination.Get(1));
}